

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O2

bool sptk::ComputeSecondOrderRegressionCoefficients
               (int n,vector<double,_std::allocator<double>_> *coefficients)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if (coefficients != (vector<double,_std::allocator<double>_> *)0x0 && 0 < n) {
    uVar1 = n * 2 + 1;
    if ((long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (ulong)uVar1) {
      std::vector<double,_std::allocator<double>_>::resize(coefficients,(ulong)uVar1);
    }
    iVar4 = n + 1;
    uVar6 = 0;
    uVar3 = (n * uVar1 * iVar4) / 3;
    iVar2 = -n;
    if (iVar4 < iVar2) {
      iVar4 = iVar2;
    }
    iVar5 = -(n * uVar1);
    for (; (uint)(iVar4 + n) != uVar6; uVar6 = uVar6 + 1) {
      (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar6] =
           (double)(int)((iVar2 + (int)uVar6) * iVar5 - uVar3) *
           (0.5 / (double)(int)(((((n * 3 + 3) * n + -1) * uVar3) / 5) * uVar1 - uVar3 * uVar3));
      iVar5 = iVar5 + uVar1;
    }
  }
  return coefficients != (vector<double,_std::allocator<double>_> *)0x0 && 0 < n;
}

Assistant:

bool ComputeSecondOrderRegressionCoefficients(
    int n, std::vector<double>* coefficients) {
  if (n <= 0 || NULL == coefficients) {
    return false;
  }

  const int a0(2 * n + 1);
  if (coefficients->size() != static_cast<std::size_t>(a0)) {
    coefficients->resize(a0);
  }
  const int a1(a0 * n * (n + 1) / 3);
  const int a2(a1 * (3 * n * n + 3 * n - 1) / 5);
  const double norm(0.5 / (a2 * a0 - a1 * a1));
  for (int j(-n), i(0); j <= n; ++j, ++i) {
    (*coefficients)[i] = (a0 * j * j - a1) * norm;
  }
  return true;
}